

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O0

void __thiscall
TPZCreateApproximationSpace::SetAllCreateFunctionsContinuous(TPZCreateApproximationSpace *this)

{
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *this_00;
  long in_RDI;
  H1Family *h1fam;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  undefined4 uVar2;
  
  *(undefined4 *)(in_RDI + 0x118) = 1;
  this_00 = (function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)(in_RDI + 0x110);
  uVar2 = *(undefined4 *)&(this_00->super__Function_base)._M_functor;
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
  uVar1 = *(undefined4 *)&(this_00->super__Function_base)._M_functor;
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,uVar1));
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,uVar1));
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,uVar1));
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,uVar1));
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,uVar1));
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,uVar1));
  std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
            (this_00,(anon_class_4_1_a7eb4cc9 *)CONCAT44(uVar2,uVar1));
  return;
}

Assistant:

void TPZCreateApproximationSpace::SetAllCreateFunctionsContinuous(){
    fStyle = EContinuous;
    const H1Family &h1fam = this->fh1fam;
    fp[EPoint] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreatePointEl(gel,mesh,h1fam);};
    fp[EOned] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateLinearEl(gel,mesh,h1fam);};
    fp[EQuadrilateral] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateQuadEl(gel,mesh,h1fam);};
    fp[ETriangle] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateTriangleEl(gel,mesh,h1fam);};
    fp[ETetraedro] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateTetraEl(gel,mesh,h1fam);};
    fp[EPiramide] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreatePyramEl(gel,mesh,h1fam);};
    fp[EPrisma] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreatePrismEl(gel,mesh,h1fam);};
    fp[ECube] = [h1fam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateCubeEl(gel,mesh,h1fam);};
    
    /*
     pzgeom::TPZGeoPoint::fp =  CreatePointEl;
     pzgeom::TPZGeoLinear::fp =  CreateLinearEl;
     pzgeom::TPZGeoQuad::fp = CreateQuadEl;
     pzgeom::TPZGeoTriangle::fp =  CreateTriangleEl;
     pzgeom::TPZGeoPrism::fp = CreatePrismEl;
     pzgeom::TPZGeoTetrahedra::fp = CreateTetraEl;
     pzgeom::TPZGeoPyramid::fp = CreatePyramEl;
     pzgeom::TPZGeoCube::fp = CreateCubeEl;
     */
	
}